

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O2

void __thiscall miniros::PollSet::update(PollSet *this,int poll_timeout)

{
  _Rb_tree_header *p_Var1;
  short sVar2;
  socket_pollfd *fds;
  int *piVar3;
  pointer piVar4;
  Level level;
  void *logger_handle;
  iterator iVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  char *pcVar7;
  pointer ppVar8;
  uint uVar9;
  int fd;
  scoped_lock<std::mutex> lock;
  SocketUpdateFunc func;
  TransportPtr transport;
  shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>_> ofds;
  
  createNativePollset(this);
  fds = (this->ufds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
        super__Vector_impl_data._M_start;
  poll_sockets((miniros *)&ofds,this->epfd_,fds,
               (long)(this->ufds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)fds >> 3,poll_timeout);
  if (ofds.
      super___shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (update::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&func,"miniros.poll_set",(allocator<char> *)&transport);
      console::initializeLogLocation(&update::loc,(string *)&func,Error);
      std::__cxx11::string::~string((string *)&func);
    }
    if (update::loc.level_ != Error) {
      console::setLogLocationLevel(&update::loc,Error);
      console::checkLogLocationEnabled(&update::loc);
    }
    logger_handle = update::loc.logger_;
    level = update::loc.level_;
    if (update::loc.logger_enabled_ == true) {
      pcVar7 = last_socket_error_string();
      console::print((FilterBase *)0x0,logger_handle,level,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp"
                     ,0xc3,"void miniros::PollSet::update(int)","poll failed with error %s",pcVar7);
    }
  }
  else {
    p_Var1 = &(this->socket_info_)._M_t._M_impl.super__Rb_tree_header;
    lock._M_device = &this->just_deleted_mutex_;
    for (ppVar8 = ((ofds.
                    super___shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super__Vector_base<pollfd,_std::allocator<pollfd>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppVar8 != ((ofds.
                    super___shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super__Vector_base<pollfd,_std::allocator<pollfd>_>)._M_impl.
                  super__Vector_impl_data._M_finish; ppVar8 = ppVar8 + 1) {
      fd = ppVar8->fd;
      sVar2 = ppVar8->revents;
      func.super__Function_base._M_manager = (_Manager_type)0x0;
      func._M_invoker = (_Invoker_type)0x0;
      func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      func.super__Function_base._M_functor._8_8_ = 0;
      transport.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      transport.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (sVar2 != 0) {
        std::mutex::lock(&this->socket_info_mutex_);
        iVar5 = std::
                _Rb_tree<int,_std::pair<const_int,_miniros::PollSet::SocketInfo>,_std::_Select1st<std::pair<const_int,_miniros::PollSet::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
                ::find((_Rb_tree<int,_std::pair<const_int,_miniros::PollSet::SocketInfo>,_std::_Select1st<std::pair<const_int,_miniros::PollSet::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
                        *)this,&fd);
        uVar9 = 0x38;
        if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
          std::function<void_(int)>::operator=
                    (&func,(function<void_(int)> *)&iVar5._M_node[1]._M_right);
          std::__shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&transport.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2> *)
                     &iVar5._M_node[1]._M_parent);
          uVar9 = *(uint *)((long)&iVar5._M_node[2]._M_right + 4) | 0x38;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&this->socket_info_mutex_);
        if ((((_Rb_tree_header *)iVar5._M_node != p_Var1) &&
            (func.super__Function_base._M_manager != (_Manager_type)0x0)) &&
           (uVar9 = uVar9 & (int)sVar2, uVar9 != 0)) {
          if (((int)sVar2 & 0x38U) != 0) {
            std::mutex::lock(lock._M_device);
            _Var6 = std::
                    __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                              ((this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish,&fd);
            piVar3 = (this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pthread_mutex_unlock((pthread_mutex_t *)lock._M_device);
            if (_Var6._M_current != piVar3) goto LAB_0023a9e7;
          }
          std::function<void_(int)>::operator()(&func,uVar9);
        }
      }
LAB_0023a9e7:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&transport.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::_Function_base::~_Function_base(&func.super__Function_base);
    }
  }
  std::mutex::lock(&this->just_deleted_mutex_);
  piVar4 = (this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar4) {
    (this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->just_deleted_mutex_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ofds.
              super___shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void PollSet::update(int poll_timeout)
{
  createNativePollset();

  // Poll across the sockets we're servicing
  std::shared_ptr<std::vector<socket_pollfd> > ofds = poll_sockets(epfd_, &ufds_.front(), ufds_.size(), poll_timeout);
  if (!ofds)
  {
    MINIROS_ERROR("poll failed with error %s", last_socket_error_string());
  }
  else
  {
    for (std::vector<socket_pollfd>::iterator it = ofds->begin() ; it != ofds->end(); ++it)
    {
      int fd = it->fd;
      int revents = it->revents;
      SocketUpdateFunc func;
      TransportPtr transport;
      int events = 0;

      if (revents == 0)
      {
        continue;
      }
      {
        std::scoped_lock<std::mutex> lock(socket_info_mutex_);
        M_SocketInfo::iterator it = socket_info_.find(fd);
        // the socket has been entirely deleted
        if (it == socket_info_.end())
        {
          continue;
        }

        const SocketInfo& info = it->second;

        // Store off the function and transport in case the socket is deleted from another thread
        func = info.func_;
        transport = info.transport_;
        events = info.events_;
      }

      // If these are registered events for this socket, OR the events are ERR/HUP/NVAL,
      // call through to the registered function
      if (func
          && ((events & revents)
              || (revents & POLLERR)
              || (revents & POLLHUP)
              || (revents & POLLNVAL)))
      {
        bool skip = false;
        if (revents & (POLLNVAL|POLLERR|POLLHUP))
        {
          // If a socket was just closed and then the file descriptor immediately reused, we can
          // get in here with what we think is a valid socket (since it was just re-added to our set)
          // but which is actually referring to the previous fd with the same #.  If this is the case,
          // we ignore the first instance of one of these errors.  If it's a real error we'll
          // hit it again next time through.
          std::scoped_lock<std::mutex> lock(just_deleted_mutex_);
          if (std::find(just_deleted_.begin(), just_deleted_.end(), fd) != just_deleted_.end())
          {
            skip = true;
          }
        }

        if (!skip)
        {
          func(revents & (events|POLLERR|POLLHUP|POLLNVAL));
        }
      }
    }
  }

  std::scoped_lock<std::mutex> lock(just_deleted_mutex_);
  just_deleted_.clear();

}